

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

int pbrt::GenerateCameraSubpath
              (Integrator *integrator,RayDifferential *ray,SampledWavelengths *lambda,
              Sampler *sampler,ScratchBuffer *scratchBuffer,int maxDepth,Camera *camera,Vertex *path
              ,bool regularize)

{
  int in_R9D;
  byte in_stack_00000018;
  Float pdfDir;
  Float pdfPos;
  SampledSpectrum beta;
  undefined1 in_stack_0000070b;
  Float in_stack_0000070c;
  ScratchBuffer *in_stack_00000710;
  Camera *in_stack_00000718;
  Sampler *in_stack_00000720;
  RayDifferential *in_stack_00000728;
  SampledWavelengths *in_stack_00000730;
  Integrator *in_stack_00000738;
  SampledSpectrum in_stack_00000744;
  int in_stack_00000760;
  TransportMode in_stack_00000768;
  Vertex *in_stack_00000770;
  undefined4 in_stack_fffffffffffffd78;
  Float in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  Float *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  Ray *in_stack_fffffffffffffd98;
  Camera *this;
  SampledSpectrum *in_stack_fffffffffffffde8;
  Ray *in_stack_fffffffffffffdf0;
  Camera *in_stack_fffffffffffffdf8;
  Camera local_1a8 [46];
  byte local_35;
  int local_4;
  
  local_35 = in_stack_00000018 & 1;
  if (in_R9D == 0) {
    local_4 = 0;
  }
  else {
    SampledSpectrum::SampledSpectrum
              ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd7c);
    this = local_1a8;
    Camera::Camera((Camera *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   (Camera *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    Vertex::CreateCamera
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    Vertex::operator=((Vertex *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                      (Vertex *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    Camera::PDF_We(this,in_stack_fffffffffffffd98,
                   (Float *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   in_stack_fffffffffffffd88);
    RayDifferential::RayDifferential
              ((RayDifferential *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (RayDifferential *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    Sampler::Sampler((Sampler *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     (Sampler *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    Camera::Camera((Camera *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   (Camera *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    local_4 = RandomWalk(in_stack_00000738,in_stack_00000730,in_stack_00000728,in_stack_00000720,
                         in_stack_00000718,in_stack_00000710,in_stack_00000744,in_stack_0000070c,
                         in_stack_00000760,in_stack_00000768,in_stack_00000770,
                         (bool)in_stack_0000070b);
    local_4 = local_4 + 1;
  }
  return local_4;
}

Assistant:

int GenerateCameraSubpath(const Integrator &integrator, const RayDifferential &ray,
                          SampledWavelengths &lambda, Sampler sampler,
                          ScratchBuffer &scratchBuffer, int maxDepth, Camera camera,
                          Vertex *path, bool regularize) {
    if (maxDepth == 0)
        return 0;
    SampledSpectrum beta(1.f);
    // Generate first vertex on camera subpath and start random walk
    Float pdfPos, pdfDir;
    path[0] = Vertex::CreateCamera(camera, ray, beta);
    camera.PDF_We(ray, &pdfPos, &pdfDir);
    return RandomWalk(integrator, lambda, ray, sampler, camera, scratchBuffer, beta,
                      pdfDir, maxDepth - 1, TransportMode::Radiance, path + 1,
                      regularize) +
           1;
}